

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void search::checkup(SearchInfo *info)

{
  bool bVar1;
  int64_t iVar2;
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (-1 < info->stopTime) {
    iVar2 = utils::getTime();
    if (info->stopTime < iVar2) {
      info->stopped = true;
    }
  }
  bVar1 = utils::inputWaiting();
  if (bVar1) {
    info->stopped = true;
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_28);
    bVar1 = std::operator==(&local_28,"quit");
    if (bVar1) {
      info->quit = true;
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void search::checkup(SearchInfo& info)
{
    if (info.getStopTime() > -1 && utils::getTime() > info.getStopTime()) {
        info.setStopped(true);
    }
    if (utils::inputWaiting()) {
        info.setStopped(true);
        std::string input;
        std::getline(std::cin, input);
        if (input == "quit") {
            info.setQuit(true);
        }
    }
}